

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

Id dxil_spv::build_load_physical_rtas
             (Impl *impl,ResourceReference *reference,Value *offset,bool non_uniform)

{
  StorageClass SVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  Builder *this;
  Operation *pOVar5;
  Operation *this_00;
  Value *local_78;
  Operation *convert_op;
  Operation *load_op;
  Operation *chain_op;
  Id uvec2_type;
  Operation *broadcast_op;
  Id offset_id;
  Id ptr_id;
  Builder *builder;
  bool non_uniform_local;
  Value *offset_local;
  ResourceReference *reference_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  SVar1 = spv::Builder::getStorageClass(this,reference->var_id);
  if (SVar1 == StorageClassStorageBuffer) {
    local_78 = offset;
    if ((reference->base_resource_is_array & 1U) == 0) {
      local_78 = (Value *)0x0;
    }
    broadcast_op._0_4_ = build_bindless_heap_offset(impl,reference,0x140,local_78);
    if (!non_uniform) {
      spv::Builder::addCapability(this,CapabilityGroupNonUniformBallot);
      IVar2 = spv::Builder::makeUintType(this,0x20);
      pOVar5 = Converter::Impl::allocate(impl,OpGroupNonUniformBroadcastFirst,IVar2);
      IVar2 = spv::Builder::makeUintConstant(this,3,false);
      Operation::add_id(pOVar5,IVar2);
      Operation::add_id(pOVar5,(Id)broadcast_op);
      Converter::Impl::add(impl,pOVar5,false);
      broadcast_op._0_4_ = pOVar5->id;
    }
    IVar2 = build_physical_address_indexing_from_ssbo(impl,(Id)broadcast_op);
    IVar3 = spv::Builder::makeUintType(this,0x20);
    IVar3 = spv::Builder::makeVectorType(this,IVar3,2);
    IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar3);
    pOVar5 = Converter::Impl::allocate(impl,OpAccessChain,IVar4);
    Operation::add_id(pOVar5,reference->var_id);
    IVar4 = spv::Builder::makeUintConstant(this,0,false);
    Operation::add_id(pOVar5,IVar4);
    Operation::add_id(pOVar5,IVar2);
    Converter::Impl::add(impl,pOVar5,false);
    this_00 = Converter::Impl::allocate(impl,OpLoad,IVar3);
    Operation::add_id(this_00,pOVar5->id);
    Converter::Impl::add(impl,this_00,false);
    broadcast_op._4_4_ = this_00->id;
  }
  else {
    broadcast_op._4_4_ = build_root_descriptor_load_physical_pointer(impl,reference);
  }
  IVar2 = spv::Builder::makeAccelerationStructureType(this);
  pOVar5 = Converter::Impl::allocate(impl,OpConvertUToAccelerationStructureKHR,IVar2);
  Operation::add_id(pOVar5,broadcast_op._4_4_);
  Converter::Impl::add(impl,pOVar5,false);
  return pOVar5->id;
}

Assistant:

static spv::Id build_load_physical_rtas(Converter::Impl &impl, const Converter::Impl::ResourceReference &reference,
                                        const llvm::Value *offset, bool non_uniform)
{
	auto &builder = impl.builder();
	spv::Id ptr_id;

	if (builder.getStorageClass(reference.var_id) == spv::StorageClassStorageBuffer)
	{
		spv::Id offset_id = build_bindless_heap_offset(impl, reference,
		                                               DESCRIPTOR_QA_TYPE_RT_ACCELERATION_STRUCTURE_BIT |
		                                               DESCRIPTOR_QA_TYPE_RAW_VA_BIT,
		                                               reference.base_resource_is_array ? offset : nullptr);

		if (!non_uniform)
		{
			builder.addCapability(spv::CapabilityGroupNonUniformBallot);
			auto *broadcast_op = impl.allocate(spv::OpGroupNonUniformBroadcastFirst, builder.makeUintType(32));
			broadcast_op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
			broadcast_op->add_id(offset_id);
			impl.add(broadcast_op);
			offset_id = broadcast_op->id;
		}

		offset_id = build_physical_address_indexing_from_ssbo(impl, offset_id);

		spv::Id uvec2_type = builder.makeVectorType(builder.makeUintType(32), 2);
		auto *chain_op =
		    impl.allocate(spv::OpAccessChain, builder.makePointer(spv::StorageClassStorageBuffer, uvec2_type));
		chain_op->add_id(reference.var_id);
		chain_op->add_id(builder.makeUintConstant(0));
		chain_op->add_id(offset_id);
		impl.add(chain_op);

		auto *load_op = impl.allocate(spv::OpLoad, uvec2_type);
		load_op->add_id(chain_op->id);
		impl.add(load_op);
		ptr_id = load_op->id;
	}
	else
	{
		ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
	}

	auto *convert_op = impl.allocate(spv::OpConvertUToAccelerationStructureKHR, builder.makeAccelerationStructureType());
	convert_op->add_id(ptr_id);
	impl.add(convert_op);
	return convert_op->id;
}